

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::
Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
          (ArenaStringPtr *this,Arena *param_2,undefined8 param_3)

{
  allocator local_51;
  string local_50 [40];
  undefined8 local_28;
  Arena *arena_local;
  char *str_local;
  ArenaStringPtr *this_local;
  
  local_28 = param_3;
  arena_local = param_2;
  str_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)param_2,&local_51);
  Set(this,local_50,local_28);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void Set(FirstParam p1, const char* str, ::google::protobuf::Arena* arena) {
    Set(p1, ConstStringParam(str), arena);
  }